

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::testDraw
          (FunctionalTest3_4 *this,GLuint program_id,GLchar *first_routine_name,
          GLchar *second_routine_name,GLchar **uniform_names,vec4<float> *expected_results,
          bool use_program_query)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLint GVar4;
  GLint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  float *pfVar9;
  TestError *this_00;
  long lVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double extraout_XMM0_Qa_00;
  GLuint subroutine_uniforms [2];
  vec4<float> results [5];
  MessageBuilder message;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  subroutine_uniforms[0] = 0;
  subroutine_uniforms[1] = 0;
  GVar4 = getSubroutineUniformLocation(this,program_id,*uniform_names,use_program_query);
  GVar5 = getSubroutineUniformLocation(this,program_id,uniform_names[1],use_program_query);
  GVar6 = getSubroutineIndex(this,program_id,first_routine_name,use_program_query);
  GVar7 = getSubroutineIndex(this,program_id,second_routine_name,use_program_query);
  subroutine_uniforms[GVar4] = GVar6;
  subroutine_uniforms[GVar5] = GVar7;
  (**(code **)(lVar10 + 0x1668))(0x8b31,2,subroutine_uniforms);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7a);
  iVar3 = (**(code **)(lVar10 + 0xb48))(program_id,"input_data");
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7e);
  if (iVar3 != -1) {
    (**(code **)(lVar10 + 0x15a0))
              (expected_results->m_x,expected_results->m_y,expected_results->m_z,
               expected_results->m_w,iVar3);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Uniform4f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xe88);
    (**(code **)(lVar10 + 0x30))(0);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"BeginTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xe8c);
    (**(code **)(lVar10 + 0x538))(0,0,1);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xe8f);
    (**(code **)(lVar10 + 0x638))();
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"EndTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xe92);
    pfVar9 = (float *)(**(code **)(lVar10 + 0xcf8))(0x8c8e,35000);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"MapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xe96);
    results[0].m_x = *pfVar9;
    results[0].m_y = pfVar9[1];
    results[0].m_z = pfVar9[2];
    results[0].m_w = pfVar9[3];
    results[1].m_x = pfVar9[4];
    results[1].m_y = pfVar9[5];
    results[1].m_z = pfVar9[6];
    results[1].m_w = pfVar9[7];
    results[2].m_x = pfVar9[8];
    results[2].m_y = pfVar9[9];
    results[2].m_z = pfVar9[10];
    results[2].m_w = pfVar9[0xb];
    results[3].m_x = pfVar9[0xc];
    results[3].m_y = pfVar9[0xd];
    results[3].m_z = pfVar9[0xe];
    results[3].m_w = pfVar9[0xf];
    results[4].m_x = pfVar9[0x10];
    results[4].m_y = pfVar9[0x11];
    results[4].m_z = pfVar9[0x12];
    results[4].m_w = pfVar9[0x13];
    (**(code **)(lVar10 + 0x1670))(0x8c8e);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"UnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xeb4);
    bVar2 = true;
    for (lVar10 = 0; lVar10 != 0x50; lVar10 = lVar10 + 0x10) {
      if (bVar2 == false) {
        bVar2 = false;
      }
      else {
        bVar2 = Utils::vec4<float>::operator==
                          ((vec4<float> *)((long)&results[0].m_x + lVar10),
                           (vec4<float> *)((long)&expected_results->m_x + lVar10));
      }
    }
    if (bVar2 == false) {
      message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = &message.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "Error. Invalid result. First routine: ");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,first_routine_name
                     );
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      ". Second routine: ");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      second_routine_name);
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = &message.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Results:");
      dVar11 = extraout_XMM0_Qa;
      for (lVar10 = 0; lVar10 != 0x50; lVar10 = lVar10 + 0x10) {
        dVar11 = Utils::vec4<float>::log((vec4<float> *)((long)&results[0].m_x + lVar10),dVar11);
      }
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      tcu::MessageBuilder::operator=(&message,(MessageBuilder *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Expected:");
      dVar11 = extraout_XMM0_Qa_00;
      for (lVar10 = 0; lVar10 != 0x50; lVar10 = lVar10 + 0x10) {
        dVar11 = Utils::vec4<float>::log
                           ((vec4<float> *)((long)&expected_results->m_x + lVar10),dVar11);
      }
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    return bVar2;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Uniform is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0xe82);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool FunctionalTest3_4::testDraw(GLuint program_id, const GLchar* first_routine_name, const GLchar* second_routine_name,
								 const GLchar** uniform_names, const Utils::vec4<GLfloat> expected_results[5],
								 bool use_program_query) const
{
	static const GLuint   n_varyings			 = 5;
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	bool				  result				 = true;
	GLuint				  subroutine_uniforms[2] = { 0 };

	/* Get subroutine uniform locations */
	GLint first_routine_location = getSubroutineUniformLocation(program_id, uniform_names[0], use_program_query);

	GLint second_routine_location = getSubroutineUniformLocation(program_id, uniform_names[1], use_program_query);

	/* Get subroutine indices */
	GLuint first_routine_index = getSubroutineIndex(program_id, first_routine_name, use_program_query);

	GLuint second_routine_index = getSubroutineIndex(program_id, second_routine_name, use_program_query);

	/* Map uniforms with subroutines */
	subroutine_uniforms[first_routine_location]  = first_routine_index;
	subroutine_uniforms[second_routine_location] = second_routine_index;

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 2 /* number of uniforms */, &subroutine_uniforms[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Get location of input_data */
	GLint input_data_location = gl.getUniformLocation(program_id, "input_data");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == input_data_location)
	{
		TCU_FAIL("Uniform is not available");
	}

	/* Set up input_data */
	gl.uniform4f(input_data_location, expected_results[0].m_x, expected_results[0].m_y, expected_results[0].m_z,
				 expected_results[0].m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Verify results */
	GLfloat* feedback_data = (GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLfloat> results[5];

	results[0].m_x = feedback_data[0];
	results[0].m_y = feedback_data[1];
	results[0].m_z = feedback_data[2];
	results[0].m_w = feedback_data[3];

	results[1].m_x = feedback_data[4];
	results[1].m_y = feedback_data[5];
	results[1].m_z = feedback_data[6];
	results[1].m_w = feedback_data[7];

	results[2].m_x = feedback_data[8];
	results[2].m_y = feedback_data[9];
	results[2].m_z = feedback_data[10];
	results[2].m_w = feedback_data[11];

	results[3].m_x = feedback_data[12];
	results[3].m_y = feedback_data[13];
	results[3].m_z = feedback_data[14];
	results[3].m_w = feedback_data[15];

	results[4].m_x = feedback_data[16];
	results[4].m_y = feedback_data[17];
	results[4].m_z = feedback_data[18];
	results[4].m_w = feedback_data[19];

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	for (GLuint i = 0; i < n_varyings; ++i)
	{
		result = result && (results[i] == expected_results[i]);
	}

	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. First routine: " << first_routine_name
											<< ". Second routine: " << second_routine_name << tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Results:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;

		message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Expected:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			expected_results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;
	}

	return result;
}